

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

void __thiscall
google::
dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::clear_to_size(dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *this,size_type new_num_buckets)

{
  int *piVar1;
  pointer ppVar2;
  ulong uVar3;
  size_type sVar4;
  float fVar5;
  
  if (this->table == (pointer)0x0) {
    piVar1 = (this->val_info).
             super_alloc_impl<Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
             .super_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>.count_;
    if (piVar1 != (int *)0x0) {
      *piVar1 = *piVar1 + 1;
    }
    ppVar2 = (pointer)malloc(new_num_buckets * 8);
    this->table = ppVar2;
  }
  else if (this->num_buckets != new_num_buckets) {
    resize_table(this,this->num_buckets,new_num_buckets);
  }
  if (new_num_buckets != 0) {
    ppVar2 = this->table;
    sVar4 = 0;
    do {
      ppVar2[sVar4].first = (this->key_info).empty_key;
      ppVar2[sVar4].second = 0;
      sVar4 = sVar4 + 1;
    } while (new_num_buckets != sVar4);
  }
  this->num_deleted = 0;
  this->num_elements = 0;
  this->num_buckets = new_num_buckets;
  fVar5 = (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
          enlarge_factor_ * (float)new_num_buckets;
  uVar3 = (ulong)fVar5;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  enlarge_threshold_ = (long)(fVar5 - 9.223372e+18) & (long)uVar3 >> 0x3f | uVar3;
  fVar5 = (float)new_num_buckets *
          (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
          shrink_factor_;
  uVar3 = (ulong)fVar5;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  shrink_threshold_ = (long)(fVar5 - 9.223372e+18) & (long)uVar3 >> 0x3f | uVar3;
  (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  consider_shrink_ = false;
  return;
}

Assistant:

void clear_to_size(size_type new_num_buckets) {
    if (!table) {
      table = val_info.allocate(new_num_buckets);
    } else {
      destroy_buckets(0, num_buckets);
      if (new_num_buckets != num_buckets) {  // resize, if necessary
        typedef std::integral_constant<
            bool, std::is_same<value_alloc_type,
                               libc_allocator_with_realloc<value_type>>::value>
            realloc_ok;
        resize_table(num_buckets, new_num_buckets, realloc_ok());
      }
    }
    assert(table);
    fill_range_with_empty(table, new_num_buckets);
    num_elements = 0;
    num_deleted = 0;
    num_buckets = new_num_buckets;  // our new size
    settings.reset_thresholds(bucket_count());
  }